

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O2

Equality __thiscall capnp::AnyStruct::Reader::equals(Reader *this,Reader right)

{
  ushort uVar1;
  void *__s1;
  SegmentReader *pSVar2;
  CapTableReader *pCVar3;
  WirePointer *pWVar4;
  Reader right_00;
  bool bVar5;
  int iVar6;
  Equality EVar7;
  size_t __n;
  size_t sVar8;
  ulong uVar9;
  Equality EVar10;
  ulong uVar11;
  ulong uVar12;
  Reader l;
  undefined4 uStack_34;
  
  __s1 = (this->_reader).data;
  uVar9 = (ulong)((this->_reader).dataSize >> 3);
  do {
    __n = uVar9;
    if (__n == 0) break;
    uVar9 = __n - 1;
  } while (*(char *)((long)__s1 + (__n - 1)) == '\0');
  uVar9 = (ulong)(right._reader.dataSize >> 3);
  do {
    sVar8 = uVar9;
    if (sVar8 == 0) break;
    uVar9 = sVar8 - 1;
  } while (*(char *)((long)right._reader.data + (sVar8 - 1)) == '\0');
  EVar10 = NOT_EQUAL;
  if ((__n == sVar8) && (iVar6 = bcmp(__s1,right._reader.data,__n), iVar6 == 0)) {
    pSVar2 = (this->_reader).segment;
    pCVar3 = (this->_reader).capTable;
    pWVar4 = (this->_reader).pointers;
    uVar1 = (this->_reader).pointerCount;
    iVar6 = (this->_reader).nestingLimit;
    uVar11 = (ulong)uVar1 * 0x40 + 0x3fffffffc0;
    uVar9 = (ulong)uVar1;
    while (uVar9 != 0) {
      l.reader.pointer =
           (WirePointer *)((long)&(pWVar4->offsetAndKind).value + (uVar11 >> 3 & 0x7fffffff8));
      l.reader.segment = pSVar2;
      l.reader.capTable = pCVar3;
      l.reader.nestingLimit = iVar6;
      bVar5 = AnyPointer::Reader::isNull(&l);
      if (!bVar5) break;
      uVar11 = uVar11 - 0x40;
      uVar9 = uVar9 - 1;
    }
    uVar12 = (ulong)right._reader.pointerCount * 0x40 + 0x3fffffffc0;
    uVar11 = (ulong)right._reader.pointerCount;
    while (uVar11 != 0) {
      l.reader.pointer =
           (WirePointer *)
           ((long)&((right._reader.pointers)->offsetAndKind).value + (uVar12 >> 3 & 0x7fffffff8));
      l.reader.segment = right._reader.segment;
      l.reader.capTable = right._reader.capTable;
      l.reader.nestingLimit = right._reader.nestingLimit;
      bVar5 = AnyPointer::Reader::isNull(&l);
      if (!bVar5) break;
      uVar12 = uVar12 - 0x40;
      uVar11 = uVar11 - 1;
    }
    EVar10 = NOT_EQUAL;
    if (uVar9 == uVar11) {
      EVar10 = EQUAL;
      uVar11 = 0;
      while (bVar5 = uVar9 != 0, uVar9 = uVar9 - 1, bVar5) {
        l.reader.pointer =
             (WirePointer *)((long)&(pWVar4->offsetAndKind).value + (uVar11 & 0x7fffffff8));
        right_00.reader._28_4_ = uStack_34;
        right_00.reader.nestingLimit = right._reader.nestingLimit;
        right_00.reader.pointer =
             (WirePointer *)
             ((long)&((right._reader.pointers)->offsetAndKind).value + (uVar11 & 0x7fffffff8));
        right_00.reader.segment = (SegmentReader *)SUB168(right._reader._0_16_,0);
        right_00.reader.capTable = (CapTableReader *)SUB168(right._reader._0_16_,8);
        l.reader.segment = pSVar2;
        l.reader.capTable = pCVar3;
        l.reader.nestingLimit = iVar6;
        EVar7 = AnyPointer::Reader::equals(&l,right_00);
        if ((EVar7 != EQUAL) && (EVar10 = EVar7, EVar7 != UNKNOWN_CONTAINS_CAPS)) {
          if (EVar7 == NOT_EQUAL) {
            return NOT_EQUAL;
          }
          kj::_::unreachable();
        }
        uVar11 = uVar11 + 8;
      }
    }
  }
  return EVar10;
}

Assistant:

Equality AnyStruct::Reader::equals(AnyStruct::Reader right) const {
  auto dataL = getDataSection();
  size_t dataSizeL = dataL.size();
  while(dataSizeL > 0 && dataL[dataSizeL - 1] == 0) {
    -- dataSizeL;
  }

  auto dataR = right.getDataSection();
  size_t dataSizeR = dataR.size();
  while(dataSizeR > 0 && dataR[dataSizeR - 1] == 0) {
    -- dataSizeR;
  }

  if(dataSizeL != dataSizeR) {
    return Equality::NOT_EQUAL;
  }

  if(0 != memcmp(dataL.begin(), dataR.begin(), dataSizeL)) {
    return Equality::NOT_EQUAL;
  }

  auto ptrsL = getPointerSection();
  size_t ptrsSizeL = ptrsL.size();
  while (ptrsSizeL > 0 && ptrsL[ptrsSizeL - 1].isNull()) {
    -- ptrsSizeL;
  }

  auto ptrsR = right.getPointerSection();
  size_t ptrsSizeR = ptrsR.size();
  while (ptrsSizeR > 0 && ptrsR[ptrsSizeR - 1].isNull()) {
    -- ptrsSizeR;
  }

  if(ptrsSizeL != ptrsSizeR) {
    return Equality::NOT_EQUAL;
  }

  size_t i = 0;

  auto eqResult = Equality::EQUAL;
  for (; i < ptrsSizeL; i++) {
    auto l = ptrsL[i];
    auto r = ptrsR[i];
    switch(l.equals(r)) {
      case Equality::EQUAL:
        break;
      case Equality::NOT_EQUAL:
        return Equality::NOT_EQUAL;
      case Equality::UNKNOWN_CONTAINS_CAPS:
        eqResult = Equality::UNKNOWN_CONTAINS_CAPS;
        break;
      default:
        KJ_UNREACHABLE;
    }
  }

  return eqResult;
}